

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

bool ungroup_selective_repeat_new_allowed_proc
               (Am_Object *command_obj,Am_Value *new_selection,Am_Value param_3)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value_List selected_objs;
  Am_Object obj;
  Am_Value is_group;
  Am_Value_List AStack_48;
  Am_Object local_38;
  Am_Value local_30;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  local_38.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&AStack_48);
  Am_Value_List::operator=(&AStack_48,new_selection);
  bVar1 = Am_Value_List::Empty(&AStack_48);
  if (bVar1) {
LAB_0023f389:
    bVar1 = false;
  }
  else {
    Am_Value_List::Start(&AStack_48);
    while( true ) {
      bVar1 = Am_Value_List::Last(&AStack_48);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&AStack_48);
      Am_Object::operator=(&local_38,pAVar2);
      pAVar2 = Am_Object::Get(&local_38,0x1e6,1);
      Am_Value::operator=(&local_30,pAVar2);
      bVar1 = Am_Value::Valid(&local_30);
      if (!bVar1) goto LAB_0023f389;
      Am_Value_List::Next(&AStack_48);
    }
    bVar1 = Am_Check_All_Objects_For_Inactive_Slot(&AStack_48,command_obj);
  }
  Am_Value_List::~Am_Value_List(&AStack_48);
  Am_Object::~Am_Object(&local_38);
  Am_Value::~Am_Value(&local_30);
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Selective_New_Allowed_Method, bool,
                 ungroup_selective_repeat_new_allowed,
                 (Am_Object command_obj, Am_Value new_selection,
                  Am_Value /* new_value */))
{
  Am_Value is_group;
  Am_Object obj;
  Am_Value_List selected_objs;
  selected_objs = new_selection;
  if (selected_objs.Empty())
    return false;
  for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
    obj = selected_objs.Get();
    is_group = obj.Peek(Am_CREATED_GROUP);
    if (!is_group.Valid())
      return false;
  }
  return Am_Check_All_Objects_For_Inactive_Slot(selected_objs, command_obj);
}